

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.h
# Opt level: O0

vm_obj_id_t __thiscall CVmObjTads::get_superclass(CVmObjTads *this,vm_obj_id_t self,int idx)

{
  ushort uVar1;
  vm_obj_id_t vVar2;
  uint in_EDX;
  CVmObjTads *in_RDI;
  CVmObjTads *pCVar3;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  pCVar3 = in_RDI;
  uVar1 = get_sc_count((CVmObjTads *)0x348ab0);
  if (uVar1 == 0) {
    vVar2 = CVmObject::get_superclass
                      ((CVmObject *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (vm_obj_id_t)((ulong)pCVar3 >> 0x20),(int)pCVar3);
  }
  else {
    uVar1 = get_sc_count((CVmObjTads *)0x348ae2);
    if ((int)in_EDX < (int)(uint)uVar1) {
      vVar2 = get_sc(in_RDI,in_EDX);
    }
    else {
      vVar2 = 0;
    }
  }
  return vVar2;
}

Assistant:

virtual vm_obj_id_t get_superclass(VMG_ vm_obj_id_t self, int idx) const
    {
        /* 
         *   if we have no superclass, inherit the default, since we
         *   inherit from the system TadsObject class; if we have our own
         *   superclasses, return them 
         */
        if (get_sc_count() == 0)
            return CVmObject::get_superclass(vmg_ self, idx);
        else if (idx >= get_sc_count())
            return VM_INVALID_OBJ;
        else
            return get_sc(idx);
    }